

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

string_view __thiscall slang::parsing::Token::valueText(Token *this)

{
  undefined1 auVar1 [16];
  string_view local_18;
  
  if (this->kind == Identifier) {
    local_18 = rawText(this);
    if (local_18._M_len == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_18._M_str;
      local_18 = (string_view)(auVar1 << 0x40);
    }
    else if (*local_18._M_str == '\\') {
      local_18 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_18,1,0xffffffffffffffff);
    }
  }
  else if (this->kind == StringLiteral) {
    local_18 = *(string_view *)(this->info + 1);
  }
  else {
    local_18 = rawText(this);
  }
  return local_18;
}

Assistant:

std::string_view Token::valueText() const {
    switch (kind) {
        case TokenKind::StringLiteral:
            return info->stringText();
        case TokenKind::Identifier: {
            std::string_view result = rawText();
            if (!result.empty() && result[0] == '\\')
                result = result.substr(1);
            return result;
        }
        default:
            return rawText();
    }
}